

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

Long asl::inow(void)

{
  undefined1 local_18 [8];
  timeval t;
  
  gettimeofday((timeval *)local_18,(__timezone_ptr_t)0x0);
  return (long)local_18 * 1000000 + t.tv_sec;
}

Assistant:

Long inow()
{
#ifdef _WIN32
	FILETIME ft;
	GetSystemTimeAsFileTime(&ft);
	LARGE_INTEGER t;
	t.HighPart = ft.dwHighDateTime;
	t.LowPart = ft.dwLowDateTime;
	return t.QuadPart / 10;
#else
	timeval t;
	gettimeofday(&t, 0);
	return t.tv_sec * (Long)1000000 + t.tv_usec;
#endif
}